

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O2

bool __thiscall MXNetNode::has_weight(MXNetNode *this,int i)

{
  int iVar1;
  pointer piVar2;
  pointer pMVar3;
  pointer pMVar4;
  __type _Var5;
  long lVar6;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  long lVar8;
  long lVar9;
  
  if ((i < 0) ||
     (piVar2 = (this->weights).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
     (int)((ulong)((long)(this->weights).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar2) >> 2) <= i)) {
    bVar7 = false;
  }
  else {
    iVar1 = piVar2[(uint)i];
    pMVar3 = (this->nodes->super__Vector_base<MXNetNode,_std::allocator<MXNetNode>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = -1;
    lVar8 = 0;
    do {
      pMVar4 = (this->params->super__Vector_base<MXNetParam,_std::allocator<MXNetParam>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = (long)(int)(((long)(this->params->
                                 super__Vector_base<MXNetParam,_std::allocator<MXNetParam>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4) / 0x58);
      lVar9 = lVar9 + 1;
      bVar7 = lVar9 < lVar6;
      if (lVar6 <= lVar9) {
        return bVar7;
      }
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&(pMVar4->name)._M_dataplus._M_p + lVar8);
      lVar8 = lVar8 + 0x58;
      _Var5 = std::operator==(__lhs,&pMVar3[iVar1].name);
    } while (!_Var5);
  }
  return bVar7;
}

Assistant:

bool MXNetNode::has_weight(int i) const
{
    if (i < 0 || i >= (int)weights.size())
        return false;

    const std::string& node_name = (*nodes)[weights[i]].name;

    for (int j = 0; j < (int)(*params).size(); j++)
    {
        const MXNetParam& p = (*params)[j];
        if (p.name == node_name)
            return true;
    }

    return false;
}